

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_MinBits36_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MinBits36_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  reference pvVar4;
  char *pcVar5;
  size_type sVar6;
  char *pcVar7;
  char *pcVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  AssertionResult gtest_ar_6;
  CfdException *except;
  AssertionResult gtest_ar_5;
  ConfidentialTxInReference *txin;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1_1;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  ConfidentialTransactionContext context;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  double fee_rate;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Address addr2;
  Address addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  ElementsConfidentialAddress ct_addr4;
  ElementsConfidentialAddress ct_addr3;
  ElementsConfidentialAddress ct_addr2;
  ElementsConfidentialAddress ct_addr1;
  Address set_addr4;
  Address set_addr3;
  Address set_addr2;
  Address set_addr1;
  ExtPubkey key;
  Txid txid;
  TestFundElementsUtxoVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *__range1;
  uint32_t i;
  string descMulti;
  ElementsAddressFactory factory;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext tx;
  ConfidentialAssetId *in_stack_ffffffffffffd9e8;
  AbstractTxInReference *this_00;
  CoinSelectionOption *in_stack_ffffffffffffd9f0;
  ElementsConfidentialAddress *this_01;
  undefined4 in_stack_ffffffffffffd9f8;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffd9fc;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffda00;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  size_type in_stack_ffffffffffffda08;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffda10;
  undefined8 in_stack_ffffffffffffda18;
  string *psVar12;
  undefined4 in_stack_ffffffffffffda20;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffda24;
  undefined8 in_stack_ffffffffffffda28;
  NetType type;
  ElementsAddressFactory *in_stack_ffffffffffffda30;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_ffffffffffffda40;
  undefined8 in_stack_ffffffffffffda48;
  undefined7 in_stack_ffffffffffffda50;
  undefined1 in_stack_ffffffffffffda57;
  undefined4 in_stack_ffffffffffffda58;
  undefined4 in_stack_ffffffffffffda5c;
  undefined4 in_stack_ffffffffffffda60;
  undefined4 in_stack_ffffffffffffda64;
  undefined1 in_stack_ffffffffffffdac7;
  ConfidentialAssetId *in_stack_ffffffffffffdac8;
  undefined7 in_stack_ffffffffffffdad0;
  undefined1 in_stack_ffffffffffffdad7;
  ElementsConfidentialAddress *in_stack_ffffffffffffdad8;
  ConfidentialTransactionContext *in_stack_ffffffffffffdae0;
  AssertHelper local_2478;
  Message local_2470;
  uint32_t local_2468;
  undefined4 local_2464;
  AssertionResult local_2460;
  SigHashType local_2450;
  allocator local_2441;
  string local_2440;
  Privkey local_2420;
  allocator local_23f9;
  string local_23f8;
  Pubkey local_23d8;
  Txid local_23c0;
  OutPoint local_23a0;
  reference local_2378;
  ConfidentialTxInReference *local_2370;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_2368;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_2360;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *local_2348;
  string local_2328 [32];
  ConfidentialTransaction local_2308;
  CoinSelectionOption *in_stack_ffffffffffffdd50;
  AssertHelper local_2230;
  Message local_2228;
  string local_2220;
  AssertionResult local_2200;
  AssertHelper local_21f0;
  Message local_21e8;
  string local_21e0;
  AssertionResult local_21c0;
  AssertHelper local_21b0;
  Message local_21a8;
  size_type local_21a0;
  undefined8 local_2198;
  AssertionResult local_2190;
  AssertHelper local_2180;
  Message local_2178;
  int64_t local_2170;
  undefined4 local_2164;
  AssertionResult local_2160;
  AssertHelper local_2150;
  Message local_2148;
  string local_2140 [32];
  AssertionResult local_2120;
  string local_2110 [3];
  ElementsTransactionApi local_2099 [104];
  undefined1 in_stack_ffffffffffffdfcf;
  pointer in_stack_ffffffffffffdfd0;
  pointer in_stack_ffffffffffffdfd8;
  undefined8 in_stack_ffffffffffffdfe0;
  undefined8 in_stack_ffffffffffffdfe8;
  pointer in_stack_ffffffffffffdff0;
  pointer aux_rand;
  ByteData *in_stack_ffffffffffffe008;
  Extkey local_1fe0;
  Pubkey local_1f50;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe0c8;
  ConfidentialTransactionContext *in_stack_ffffffffffffe0d0;
  Extkey local_1d80;
  Pubkey local_1cf0;
  ElementsConfidentialAddress local_1cd8;
  _Base_ptr local_1b20;
  undefined1 local_1b18;
  string local_1b10;
  string local_1af0;
  _Base_ptr local_1ad0;
  undefined1 local_1ac8;
  string local_1ac0;
  string local_1aa0;
  undefined1 local_1a80 [192];
  Pubkey local_19c0;
  Address local_19a8;
  Extkey local_1828;
  Pubkey local_1798;
  Address local_1780;
  _Base_ptr local_1600;
  undefined1 local_15f8;
  Amount local_15f0;
  string local_15e0;
  _Base_ptr local_15c0;
  undefined1 local_15b8;
  Amount local_15b0;
  string local_15a0 [2];
  undefined1 local_1550 [72];
  Amount local_1508;
  Amount local_14f8;
  Extkey local_14e8;
  Pubkey local_1458 [17];
  double in_stack_ffffffffffffed50;
  undefined1 in_stack_ffffffffffffed5f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffed60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffed68;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffed70;
  string *in_stack_ffffffffffffed78;
  ElementsTransactionApi *in_stack_ffffffffffffed80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffeda0;
  ConfidentialAssetId *in_stack_ffffffffffffeda8;
  Amount *in_stack_ffffffffffffedb8;
  UtxoFilter *in_stack_ffffffffffffedc0;
  CoinSelectionOption *in_stack_ffffffffffffedc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffedd0;
  NetType_conflict in_stack_ffffffffffffedd8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffede0;
  Amount *in_stack_ffffffffffffede8;
  Pubkey local_11f8;
  ElementsConfidentialAddress local_11e0;
  Extkey local_1028;
  Pubkey local_f98;
  ElementsConfidentialAddress local_f80;
  Extkey local_dc8;
  Pubkey local_d38;
  ElementsConfidentialAddress local_d20;
  Extkey local_b68;
  Pubkey local_ad8;
  Address local_ac0;
  Extkey local_940;
  Pubkey local_8b0;
  Address local_898;
  Extkey local_718;
  Pubkey local_688;
  Address local_670;
  Extkey local_4f0;
  Pubkey local_460;
  Address local_448;
  allocator local_2c1;
  string local_2c0;
  ExtPubkey local_2a0;
  ConfidentialAssetId local_210;
  Amount local_1e8;
  Txid local_1d8;
  Txid local_1b8;
  Txid local_198;
  reference local_178;
  TestFundElementsUtxoVector *local_170;
  __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
  local_168;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *local_160;
  uint local_158;
  allocator local_151;
  string local_150 [88];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_f8;
  AbstractTransaction local_e0 [14];
  
  type = (NetType)((ulong)in_stack_ffffffffffffda28 >> 0x20);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffda24,in_stack_ffffffffffffda20),
             (uint32_t)((ulong)in_stack_ffffffffffffda18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffda18);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2d5d30);
  cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_ffffffffffffda30,type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_150,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_151);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::size
            (&kFundCoinSelectElementsTestVector2);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (in_stack_ffffffffffffda10,in_stack_ffffffffffffda08);
  local_158 = 0;
  local_160 = &kFundCoinSelectElementsTestVector2;
  local_168._M_current =
       (TestFundElementsUtxoVector *)
       std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::begin
                 ((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffd9e8);
  local_170 = (TestFundElementsUtxoVector *)
              std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
              end((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffd9e8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd9f0,
                            (__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd9e8), bVar1) {
    local_178 = __gnu_cxx::
                __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                ::operator*(&local_168);
    cfd::core::Txid::Txid(&local_198);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1b8,&local_178->txid);
      cfd::core::Txid::operator=(&local_198,&local_1b8);
      cfd::core::Txid::~Txid((Txid *)0x2d5e76);
    }
    cfd::core::Txid::Txid(&local_1d8,&local_178->txid);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    cfd::core::Txid::operator=(&pvVar4->txid,&local_1d8);
    cfd::core::Txid::~Txid((Txid *)0x2d5f62);
    uVar2 = local_178->vout;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    pvVar4->vout = uVar2;
    cfd::core::Amount::Amount(&local_1e8,local_178->amount);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    (pvVar4->amount).ignore_check_ = local_1e8.ignore_check_;
    (pvVar4->amount).amount_ = local_1e8.amount_;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_210,&local_178->asset);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    cfd::core::ConfidentialAssetId::operator=(&pvVar4->asset,&local_210);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2d6038);
    psVar12 = &local_178->descriptor;
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    std::__cxx11::string::operator=((string *)&pvVar4->descriptor,(string *)psVar12);
    pvVar4 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_f8,(ulong)local_158);
    pvVar4->address_type = kP2shP2wpkhAddress;
    local_158 = local_158 + 1;
    cfd::core::Txid::~Txid((Txid *)0x2d60b9);
    __gnu_cxx::
    __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
    ::operator++(&local_168);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_2c1);
  cfd::core::ExtPubkey::ExtPubkey(&local_2a0,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_4f0,&local_2a0,0xb);
  cfd::core::Extkey::GetPubkey(&local_460,&local_4f0);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d61e4);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d61f1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_718,&local_2a0,0xc);
  cfd::core::Extkey::GetPubkey(&local_688,&local_718);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6250);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d625d);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_940,&local_2a0,0xd);
  cfd::core::Extkey::GetPubkey(&local_8b0,&local_940);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d62bc);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d62c9);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_b68,&local_2a0,0xe);
  cfd::core::Extkey::GetPubkey(&local_ad8,&local_b68);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6328);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d6335);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_dc8,&local_2a0,0x6f);
  cfd::core::Extkey::GetPubkey(&local_d38,&local_dc8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_d20,&local_448,&local_d38);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6394);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d63a1);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1028,&local_2a0,0x70);
  cfd::core::Extkey::GetPubkey(&local_f98,&local_1028);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_f80,&local_670,&local_f98);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6400);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d640d);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&stack0xffffffffffffed78,&local_2a0,0x71);
  cfd::core::Extkey::GetPubkey(&local_11f8,(Extkey *)&stack0xffffffffffffed78);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_11e0,&local_898,&local_11f8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d646c);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d6479);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_14e8,&local_2a0,0x72);
  cfd::core::Extkey::GetPubkey(local_1458,&local_14e8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(local_1458 + 1),&local_ac0,local_1458);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d64d8);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d64e5);
  cfd::core::Amount::Amount(&local_14f8,300000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8,
             (Amount *)CONCAT17(in_stack_ffffffffffffdad7,in_stack_ffffffffffffdad0),
             in_stack_ffffffffffffdac8,(bool)in_stack_ffffffffffffdac7);
  cfd::core::Amount::Amount(&local_1508,50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8,
             (Amount *)CONCAT17(in_stack_ffffffffffffdad7,in_stack_ffffffffffffdad0),
             in_stack_ffffffffffffdac8,(bool)in_stack_ffffffffffffdac7);
  cfd::core::Amount::Amount((Amount *)(local_1550 + 0x38),50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8,
             (Amount *)CONCAT17(in_stack_ffffffffffffdad7,in_stack_ffffffffffffdad0),
             in_stack_ffffffffffffdac8,(bool)in_stack_ffffffffffffdac7);
  cfd::core::Amount::Amount((Amount *)(local_1550 + 0x28),50000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffdae0,in_stack_ffffffffffffdad8,
             (Amount *)CONCAT17(in_stack_ffffffffffffdad7,in_stack_ffffffffffffdad0),
             in_stack_ffffffffffffdac8,(bool)in_stack_ffffffffffffdac7);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1550,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2d6610);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_15a0,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_15b0,0);
  pVar9 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffda00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
                     (Amount *)in_stack_ffffffffffffd9f0);
  local_15c0 = (_Base_ptr)pVar9.first._M_node;
  local_15b8 = pVar9.second;
  std::__cxx11::string::~string((string *)local_15a0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_15e0,&exp_dummy_asset_b);
  cfd::core::Amount::Amount(&local_15f0,0);
  pVar9 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffda00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
                     (Amount *)in_stack_ffffffffffffd9f0);
  local_1600 = (_Base_ptr)pVar9.first._M_node;
  local_15f8 = pVar9.second;
  std::__cxx11::string::~string((string *)&local_15e0);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1828,&local_2a0,1);
  cfd::core::Extkey::GetPubkey(&local_1798,&local_1828);
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6773);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d6780);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)(local_1a80 + 0x30),&local_2a0,2);
  cfd::core::Extkey::GetPubkey(&local_19c0,(Extkey *)(local_1a80 + 0x30));
  cfd::AddressFactory::CreateP2wpkhAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
             (Pubkey *)in_stack_ffffffffffffd9f0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d67df);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d67ec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2d67f9);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1aa0,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1ac0,&local_1780);
  pVar10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     (in_stack_ffffffffffffda00,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffd9f0);
  local_1ad0 = (_Base_ptr)pVar10.first._M_node;
  local_1ac8 = pVar10.second;
  std::__cxx11::string::~string((string *)&local_1ac0);
  std::__cxx11::string::~string((string *)&local_1aa0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1af0,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1b10,&local_19a8);
  pVar10 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     (in_stack_ffffffffffffda00,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd9fc,in_stack_ffffffffffffd9f8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffd9f0);
  local_1b20 = (_Base_ptr)pVar10.first._M_node;
  local_1b18 = pVar10.second;
  std::__cxx11::string::~string((string *)&local_1b10);
  std::__cxx11::string::~string((string *)&local_1af0);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1d80,&local_2a0,0x5b);
  cfd::core::Extkey::GetPubkey(&local_1cf0,&local_1d80);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1cd8,&local_1780,&local_1cf0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d697e);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d698b);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1fe0,&local_2a0,0x5c);
  cfd::core::Extkey::GetPubkey(&local_1f50,&local_1fe0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)&stack0xffffffffffffe0c8,&local_19a8,&local_1f50);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d69ea);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d69f7);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2d6a04);
  aux_rand = (pointer)0x3fb999999999999a;
  cfd::core::Amount::Amount((Amount *)&stack0xffffffffffffdff0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2d6a32);
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_ffffffffffffd9f0);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffdd50);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_ffffffffffffd9f0,(double)in_stack_ffffffffffffd9e8);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            (in_stack_ffffffffffffd9f0,(double)in_stack_ffffffffffffd9e8);
  cfd::CoinSelectionOption::SetFeeAsset(in_stack_ffffffffffffd9f0,in_stack_ffffffffffffd9e8);
  cfd::CoinSelectionOption::SetBlindInfo((CoinSelectionOption *)(local_2099 + 1),0,0x24);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(local_2099);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(local_2110,local_e0);
  psVar12 = (string *)&stack0xffffffffffffdfd0;
  pcVar8 = &stack0xffffffffffffdfec;
  this_02 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)&stack0xffffffffffffdff0;
  this_01 = (ElementsConfidentialAddress *)local_1550;
  this_00 = (AbstractTxInReference *)local_1a80;
  uVar13 = 4;
  uVar11 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffed80,in_stack_ffffffffffffed78,in_stack_ffffffffffffed70,
             in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,in_stack_ffffffffffffeda0,
             in_stack_ffffffffffffeda8,(bool)in_stack_ffffffffffffed5f,in_stack_ffffffffffffed50,
             in_stack_ffffffffffffedb8,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedc8,
             in_stack_ffffffffffffedd0,in_stack_ffffffffffffedd8,in_stack_ffffffffffffede0,
             in_stack_ffffffffffffede8);
  std::__cxx11::string::~string((string *)local_2110);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2120,"kExpTxData","ctx.GetHex().c_str()",
             "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000"
             ,pcVar5);
  std::__cxx11::string::~string(local_2140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2120);
  if (!bVar1) {
    testing::Message::Message(&local_2148);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d72d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x326,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2150,&local_2148);
    testing::internal::AssertHelper::~AssertHelper(&local_2150);
    testing::Message::~Message((Message *)0x2d7333);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d738b);
  local_2164 = 0x264;
  local_2170 = cfd::core::Amount::GetSatoshiValue((Amount *)&stack0xffffffffffffdff0);
  testing::internal::EqHelper<false>::Compare<int,long>
            (pcVar8,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffd9fc,uVar11),
             (long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2160);
  if (!bVar1) {
    testing::Message::Message(&local_2178);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d7459);
    testing::internal::AssertHelper::AssertHelper
              (&local_2180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x327,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2180,&local_2178);
    testing::internal::AssertHelper::~AssertHelper(&local_2180);
    testing::Message::~Message((Message *)0x2d74bc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d7514);
  local_2198 = 2;
  local_21a0 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack0xffffffffffffdfd0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (pcVar8,(char *)this_02,(unsigned_long *)CONCAT44(in_stack_ffffffffffffd9fc,uVar11),
             (unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2190);
  if (!bVar1) {
    testing::Message::Message(&local_21a8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d75d1);
    testing::internal::AssertHelper::AssertHelper
              (&local_21b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x328,pcVar5);
    testing::internal::AssertHelper::operator=(&local_21b0,&local_21a8);
    testing::internal::AssertHelper::~AssertHelper(&local_21b0);
    testing::Message::~Message((Message *)0x2d7634);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d768c);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffdfd0);
  if (sVar6 == 2) {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_21e0,&local_1780);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffdfd0,1);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_21c0,"addr1.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",pcVar5,pcVar7);
    std::__cxx11::string::~string((string *)&local_21e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_21c0);
    if (!bVar1) {
      testing::Message::Message(&local_21e8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d77b3);
      testing::internal::AssertHelper::AssertHelper
                (&local_21f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_21f0,&local_21e8);
      testing::internal::AssertHelper::~AssertHelper(&local_21f0);
      testing::Message::~Message((Message *)0x2d7816);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d786e);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_2220,&local_19a8);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffdfd0,0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2200,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",pcVar5,pcVar7);
    std::__cxx11::string::~string((string *)&local_2220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2200);
    if (!bVar1) {
      testing::Message::Message(&local_2228);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d797d);
      testing::internal::AssertHelper::AssertHelper
                (&local_2230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x32c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2230,&local_2228);
      testing::internal::AssertHelper::~AssertHelper(&local_2230);
      testing::Message::~Message((Message *)0x2d79e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d7a35);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffda24,uVar13),psVar12);
  std::__cxx11::string::~string(local_2328);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2d7a99);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd9fc,uVar11));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd9fc,uVar11));
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            (in_stack_ffffffffffffe0d0,in_stack_ffffffffffffe0c8);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
              *)CONCAT44(in_stack_ffffffffffffda5c,in_stack_ffffffffffffda58),
             CONCAT17(in_stack_ffffffffffffda57,in_stack_ffffffffffffda50),
             (int)((ulong)in_stack_ffffffffffffda48 >> 0x20),(int)in_stack_ffffffffffffda48,
             in_stack_ffffffffffffda40);
  cfd::core::ConfidentialTransaction::GetTxInList(&local_2360,&local_2308);
  local_2348 = &local_2360;
  local_2368._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                *)this_00);
  local_2370 = (ConfidentialTxInReference *)
               std::
               vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                      *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_01,
                            (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_00), bVar1) {
    local_2378 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                 ::operator*(&local_2368);
    cfd::core::AbstractTxInReference::GetTxid(this_00);
    uVar2 = cfd::core::AbstractTxInReference::GetVout(&local_2378->super_AbstractTxInReference);
    cfd::core::OutPoint::OutPoint(&local_23a0,&local_23c0,uVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_23f8,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_23f9);
    cfd::core::Pubkey::Pubkey(&local_23d8,&local_23f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2440,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               &local_2441);
    cfd::core::Privkey::FromWif(&local_2420,&local_2440,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_2450);
    this_01 = (ElementsConfidentialAddress *)0x0;
    this_00 = (AbstractTxInReference *)0x0;
    cfd::ConfidentialTransactionContext::SignWithKey
              ((ConfidentialTransactionContext *)in_stack_ffffffffffffdff0,
               (OutPoint *)in_stack_ffffffffffffdfe8,(Pubkey *)in_stack_ffffffffffffdfe0,
               (Privkey *)in_stack_ffffffffffffdfd8,(SigHashType *)in_stack_ffffffffffffdfd0,
               (bool)in_stack_ffffffffffffdfcf,(ByteData256 *)aux_rand,in_stack_ffffffffffffe008);
    cfd::core::Privkey::~Privkey((Privkey *)0x2d7d1e);
    std::__cxx11::string::~string((string *)&local_2440);
    std::allocator<char>::~allocator((allocator<char> *)&local_2441);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d7d45);
    std::__cxx11::string::~string((string *)&local_23f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_23f9);
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d7d6c);
    cfd::core::Txid::~Txid((Txid *)0x2d7d79);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_2368);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)this_02);
  uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_2308);
  if (((uVar2 != 0x17e6) &&
      (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_2308), uVar2 != 0x17e7)) &&
     (uVar2 = cfd::core::ConfidentialTransaction::GetVsize(&local_2308), uVar2 != 0x17e8)) {
    local_2464 = 100;
    local_2468 = cfd::core::ConfidentialTransaction::GetVsize(&local_2308);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              (pcVar8,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffd9fc,uVar11),
               (uint *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2460);
    if (!bVar1) {
      testing::Message::Message(&local_2470);
      pcVar8 = testing::AssertionResult::failure_message((AssertionResult *)0x2d7fb9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2478,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x33c,pcVar8);
      testing::internal::AssertHelper::operator=(&local_2478,&local_2470);
      testing::internal::AssertHelper::~AssertHelper(&local_2478);
      testing::Message::~Message((Message *)0x2d8016);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d806b);
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2d80b3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2d80f4);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2d811b);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2d8128);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(this_01);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::Address::~Address(&this_01->unblinded_address_);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d819d);
  std::__cxx11::string::~string(local_150);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2d84aa);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MinBits36) {
  static const char* const kExpTxData = "0200000000040a503dbd4f8f2b064c70e048b21f93fe4584174478abf5f44747932cd21da87c0000000000ffffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000ffffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000ffffffff020b0000000000000000000000000000000000000000000000000000000000000000000000ffffffff070100000000000000000000000000000000000000000000000000000000000000aa01000110d9316ec00003b86ca86f23bc47e6ae1eebf2dea191f0ab98b89e2d5b6e5e8de20631441caeaa1600144352a1a6e86311f22274f7ebb2746de21b09b15d0100000000000000000000000000000000000000000000000000000000000000bb010000000ba43b740003a9dda6bdef90309c4fb5fe9131e396e9f9b32dc1b8defea451f71e6af1127b1d1600148beaaac4654cf4ebd8e46ca5062b0e7fb3e7470c0100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b740003fef01583b95b37ee4f23d3673dfcc01faa4654272c289e8e3caa6aeb31f634741600144852255c0ff013e835689f30fb52508f89b6fbe20100000000000000000000000000000000000000000000000000000000000000aa010000000ba43b7400037703a4ef463f044f462f35c4dece9d1f02d32681079c2c01cea4d6267dd782ef1600143159e9a1f6cdd588b6d5df65c3c7a190ecf0fba70100000000000000000000000000000000000000000000000000000000000000aa01000000000000026400000100000000000000000000000000000000000000000000000000000000000000bb01000000a2fb40580000160014a53be40113bb50f2b8b2d0bfea1e823e75632b5f0100000000000000000000000000000000000000000000000000000000000000aa01000000fd340d189c0016001478eb9fc2c9e1cdf633ecb646858ba862b21384ab00000000";

  ConfidentialTransactionContext tx(uint32_t{2}, uint32_t{0});
  std::vector<UtxoData> utxos;
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  std::string descMulti = "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))";

  try {
    utxos.resize(kFundCoinSelectElementsTestVector2.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector2) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    // add txout
    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    Address set_addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(11).GetPubkey());
    Address set_addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(12).GetPubkey());
    Address set_addr3 = factory.CreateP2wpkhAddress(key.DerivePubkey(13).GetPubkey());
    Address set_addr4 = factory.CreateP2wpkhAddress(key.DerivePubkey(14).GetPubkey());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        set_addr1, key.DerivePubkey(111).GetPubkey());
    ElementsConfidentialAddress ct_addr2 = ElementsConfidentialAddress(
        set_addr2, key.DerivePubkey(112).GetPubkey());
    ElementsConfidentialAddress ct_addr3 = ElementsConfidentialAddress(
        set_addr3, key.DerivePubkey(113).GetPubkey());
    ElementsConfidentialAddress ct_addr4 = ElementsConfidentialAddress(
        set_addr4, key.DerivePubkey(114).GetPubkey());
    tx.AddTxOut(ct_addr1, Amount(int64_t{300000000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr2, Amount(int64_t{50000000000}), exp_dummy_asset_b);
    tx.AddTxOut(ct_addr3, Amount(int64_t{50000000000}), exp_dummy_asset_a);
    tx.AddTxOut(ct_addr4, Amount(int64_t{50000000000}), exp_dummy_asset_a);

    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{0}));
    Address addr1 = factory.CreateP2wpkhAddress(key.DerivePubkey(1).GetPubkey());
    Address addr2 = factory.CreateP2wpkhAddress(key.DerivePubkey(2).GetPubkey());
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    double fee_rate = 0.1;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(fee_rate);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

    EXPECT_STREQ(kExpTxData, ctx.GetHex().c_str());
    EXPECT_EQ(612, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{2}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{2})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[1].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet));
    }
    if ((context.GetVsize() != 6118) && (context.GetVsize() != 6119) && (context.GetVsize() != 6120)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}